

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O0

bool Rct::writeFile(Path *path,String *data,int perm)

{
  bool bVar1;
  char *pcVar2;
  size_t __size;
  size_t sVar3;
  int w;
  undefined1 local_50 [8];
  Path parent;
  FILE *f;
  int perm_local;
  String *data_local;
  Path *path_local;
  
  pcVar2 = String::nullTerminated(&path->super_String);
  parent.super_String.mString.field_2._8_8_ = fopen(pcVar2,"w");
  if ((FILE *)parent.super_String.mString.field_2._8_8_ == (FILE *)0x0) {
    Path::parentDir((Path *)local_50,path);
    bVar1 = String::isEmpty((String *)local_50);
    if (bVar1) {
      path_local._7_1_ = 0;
      bVar1 = true;
    }
    else {
      Path::mkdir((Path *)local_50,(char *)0x1,0x1ed);
      pcVar2 = String::nullTerminated(&path->super_String);
      parent.super_String.mString.field_2._8_8_ = fopen(pcVar2,"w");
      if ((FILE *)parent.super_String.mString.field_2._8_8_ == (FILE *)0x0) {
        path_local._7_1_ = 0;
        bVar1 = true;
      }
      else {
        bVar1 = false;
      }
    }
    Path::~Path((Path *)local_50);
    if (bVar1) goto LAB_0027fbb1;
  }
  pcVar2 = String::data(data);
  __size = String::size(data);
  sVar3 = fwrite(pcVar2,__size,1,(FILE *)parent.super_String.mString.field_2._8_8_);
  fclose((FILE *)parent.super_String.mString.field_2._8_8_);
  if ((int)sVar3 == 1) {
    if (-1 < perm) {
      pcVar2 = String::constData(&path->super_String);
      chmod(pcVar2,perm);
    }
    path_local._7_1_ = 1;
  }
  else {
    pcVar2 = String::nullTerminated(&path->super_String);
    unlink(pcVar2);
    path_local._7_1_ = 0;
  }
LAB_0027fbb1:
  return (bool)(path_local._7_1_ & 1);
}

Assistant:

bool writeFile(const Path& path, const String& data, int perm)
{
    FILE* f = fopen(path.nullTerminated(), "w");
    if (!f) {
        // try to make the directory and reopen
        const Path parent = path.parentDir();
        if (parent.isEmpty())
            return false;
        Path::mkdir(parent, Path::Recursive);
        f = fopen(path.nullTerminated(), "w");
        if (!f)
            return false;
    }
    const int w = fwrite(data.data(), data.size(), 1, f);
    fclose(f);
    if (w != 1) {
        unlink(path.nullTerminated());
        return false;
    }
    if (perm >= 0)
        chmod(path.constData(), static_cast<mode_t>(perm));

    return true;
}